

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

int __thiscall
higan::TimerManager::GetTimeoutTimer
          (TimerManager *this,vector<higan::Timer,_std::allocator<higan::Timer>_> *timeout_timers)

{
  bool bVar1;
  int64_t time;
  const_reference this_00;
  TimeStamp *pTVar2;
  bool local_ab;
  undefined1 local_98 [8];
  Timer new_timer;
  Timer *timer;
  int result_count;
  TimeStamp local_28;
  TimeStamp now;
  vector<higan::Timer,_std::allocator<higan::Timer>_> *timeout_timers_local;
  TimerManager *this_local;
  
  now.microsecond_time_ = (int64_t)timeout_timers;
  bVar1 = std::
          priority_queue<higan::Timer,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>,_std::less<higan::Timer>_>
          ::empty(&this->timer_queue_);
  if ((bVar1) || (now.microsecond_time_ == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    time = TimeStamp::Now();
    TimeStamp::TimeStamp(&local_28,time);
    this_00 = std::
              priority_queue<higan::Timer,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>,_std::less<higan::Timer>_>
              ::top(&this->timer_queue_);
    pTVar2 = Timer::GetExpireTime(this_00);
    (this->min_expire_time).microsecond_time_ = pTVar2->microsecond_time_;
    bVar1 = TimeStamp::operator<(&local_28,&this->min_expire_time);
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      timer._4_4_ = 0;
      while( true ) {
        bVar1 = std::
                priority_queue<higan::Timer,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>,_std::less<higan::Timer>_>
                ::empty(&this->timer_queue_);
        local_ab = false;
        if (!bVar1) {
          local_ab = TimeStamp::operator<=(&this->min_expire_time,&local_28);
        }
        if (local_ab == false) break;
        timer._4_4_ = timer._4_4_ + 1;
        new_timer.timer_callback_._M_invoker =
             (_Invoker_type)
             std::
             priority_queue<higan::Timer,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>,_std::less<higan::Timer>_>
             ::top(&this->timer_queue_);
        pTVar2 = Timer::GetExpireTime((Timer *)new_timer.timer_callback_._M_invoker);
        (this->min_expire_time).microsecond_time_ = pTVar2->microsecond_time_;
        std::vector<higan::Timer,_std::allocator<higan::Timer>_>::push_back
                  ((vector<higan::Timer,_std::allocator<higan::Timer>_> *)now.microsecond_time_,
                   (value_type *)new_timer.timer_callback_._M_invoker);
        bVar1 = Timer::Repeat((Timer *)new_timer.timer_callback_._M_invoker);
        if (bVar1) {
          Timer::Timer((Timer *)local_98,(Timer *)new_timer.timer_callback_._M_invoker);
          Timer::AdjustExpireTime((Timer *)local_98);
          Insert(this,(Timer *)local_98);
          Timer::~Timer((Timer *)local_98);
        }
        std::
        priority_queue<higan::Timer,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>,_std::less<higan::Timer>_>
        ::pop(&this->timer_queue_);
      }
      this_local._4_4_ = timer._4_4_;
    }
    TimeStamp::~TimeStamp(&local_28);
  }
  return this_local._4_4_;
}

Assistant:

int TimerManager::GetTimeoutTimer(std::vector<Timer>* timeout_timers)
{
	if (timer_queue_.empty() || timeout_timers == nullptr)
	{
		return 0;
	}

	TimeStamp now(TimeStamp::Now());
	min_expire_time = timer_queue_.top().GetExpireTime();

	if (now < min_expire_time)
	{
		return 0;
	}

	int result_count = 0;

	while (!timer_queue_.empty() && min_expire_time <= now)
	{
		result_count++;

		const Timer& timer = timer_queue_.top();
		min_expire_time = timer.GetExpireTime();

		timeout_timers->push_back(timer);

		if (timer.Repeat())
		{
			Timer new_timer(timer);
			new_timer.AdjustExpireTime();
			Insert(new_timer);
		}

		timer_queue_.pop();
	}

	return result_count;
}